

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

CompressedTexFormat tcu::getAstcFormatByBlockSize(IVec3 *size,bool isSRGB)

{
  bool bVar1;
  InternalError *pIVar2;
  uint uVar3;
  int local_134;
  int local_130;
  int local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (1 < size->m_data[2]) {
    pIVar2 = (InternalError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"3D ASTC textures not currently supported",
               (allocator<char> *)&local_108);
    InternalError::InternalError(pIVar2,&local_128);
    __cxa_throw(pIVar2,&InternalError::typeinfo,Exception::~Exception);
  }
  uVar3 = 0xfffffff5;
  do {
    if (uVar3 == 0x1c) {
      pIVar2 = (InternalError *)__cxa_allocate_exception(0x38);
      local_12c = size->m_data[0];
      de::toString<int>(&local_a8,&local_12c);
      std::operator+(&local_88,"Invalid ASTC block size ",&local_a8);
      std::operator+(&local_68,&local_88,"x");
      local_130 = size->m_data[1];
      de::toString<int>(&local_c8,&local_130);
      std::operator+(&local_48,&local_68,&local_c8);
      std::operator+(&local_108,&local_48,"x");
      local_134 = size->m_data[2];
      de::toString<int>(&local_e8,&local_134);
      std::operator+(&local_128,&local_108,&local_e8);
      InternalError::InternalError(pIVar2,&local_128);
      __cxa_throw(pIVar2,&InternalError::typeinfo,Exception::~Exception);
    }
    if (uVar3 < 0x1c) {
      getBlockPixelSize((tcu *)&local_128,uVar3 + COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA);
      bVar1 = Vector<int,_3>::operator==((Vector<int,_3> *)&local_128,size);
      if ((bVar1) && (uVar3 - 0xe < 0xe == isSRGB)) {
        return uVar3 + COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

CompressedTexFormat getAstcFormatByBlockSize (const IVec3& size, bool isSRGB)
{
	if (size.z() > 1)
		throw InternalError("3D ASTC textures not currently supported");

	for (int fmtI = 0; fmtI < COMPRESSEDTEXFORMAT_LAST; fmtI++)
	{
		const CompressedTexFormat fmt = (CompressedTexFormat)fmtI;

		if (isAstcFormat(fmt) && getBlockPixelSize(fmt) == size && isAstcSRGBFormat(fmt) == isSRGB)
			return fmt;
	}

	throw InternalError("Invalid ASTC block size " + de::toString(size.x()) + "x" + de::toString(size.y()) + "x" + de::toString(size.z()));
}